

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<unsigned_long> __thiscall
capnp::compiler::Compiler::Impl::lookup(Impl *this,uint64_t parent,StringPtr childName)

{
  Maybe<capnp::compiler::Compiler::Node_&> this_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  size_t in_R8;
  Maybe<unsigned_long> MVar1;
  StringPtr name;
  uint64_t parent_local;
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  child;
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_90;
  
  parent_local = (uint64_t)childName.content.ptr;
  this_00 = findNode((Impl *)parent,parent_local);
  if (this_00.ptr != (Node *)0x0) {
    name.content.size_ = in_R8;
    name.content.ptr = (char *)childName.content.size_;
    Node::resolveMember((Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                         *)&local_90,this_00.ptr,name);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::NullableValue(&child,&local_90);
    if ((child.isSet == true) && (child.field_1.value.tag == 1)) {
      *(undefined1 *)&(this->super_LazyLoadCallback)._vptr_LazyLoadCallback = 1;
      *(undefined8 *)&this->annotationFlag = child.field_1._8_8_;
    }
    else {
      *(undefined1 *)&(this->super_LazyLoadCallback)._vptr_LazyLoadCallback = 0;
    }
    MVar1.ptr.field_1.value = extraout_RDX.value;
    MVar1.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar1.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],unsigned_long&>
            ((Fault *)&child,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x4e0,FAILED,(char *)0x0,
             "\"lookup()s parameter \'parent\' must be a known ID.\", parent",
             (char (*) [49])"lookup()s parameter \'parent\' must be a known ID.",&parent_local);
  kj::_::Debug::Fault::fatal((Fault *)&child);
}

Assistant:

kj::Maybe<uint64_t> Compiler::Impl::lookup(uint64_t parent, kj::StringPtr childName) {
  // Looking up members does not use the workspace, so we don't need to lock it.
  KJ_IF_MAYBE(parentNode, findNode(parent)) {
    KJ_IF_MAYBE(child, parentNode->resolveMember(childName)) {
      if (child->is<NodeTranslator::Resolver::ResolvedDecl>()) {
        return child->get<NodeTranslator::Resolver::ResolvedDecl>().id;
      } else {
        // An alias. We don't support looking up aliases with this method.
        return nullptr;
      }
    } else {
      return nullptr;
    }
  } else {
    KJ_FAIL_REQUIRE("lookup()s parameter 'parent' must be a known ID.", parent);
  }
}